

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_client1.c
# Opt level: O0

int main(void)

{
  uint32_t flags_00;
  size_t len_00;
  char local_1158 [8];
  char error_buf [100];
  char local_10e8 [8];
  char vrfy_buf [512];
  undefined1 local_ee0 [8];
  mbedtls_x509_crt cacert;
  mbedtls_ssl_config conf;
  mbedtls_ssl_context ssl;
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_entropy_context entropy;
  char *pers;
  uchar buf [1024];
  mbedtls_net_context local_18;
  uint32_t flags;
  mbedtls_net_context server_fd;
  int len;
  int ret;
  
  mbedtls_debug_set_threshold(1);
  mbedtls_net_init(&local_18);
  mbedtls_ssl_init((mbedtls_ssl_context *)&conf.max_major_ver);
  mbedtls_ssl_config_init((mbedtls_ssl_config *)&cacert.next);
  mbedtls_x509_crt_init((mbedtls_x509_crt *)local_ee0);
  mbedtls_ctr_drbg_init((mbedtls_ctr_drbg_context *)(ssl.peer_verify_data + 4));
  printf("\n  . Seeding the random number generator...");
  fflush(_stdout);
  mbedtls_entropy_init((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
  len_00 = strlen("ssl_client1");
  server_fd.fd = mbedtls_ctr_drbg_seed
                           ((mbedtls_ctr_drbg_context *)(ssl.peer_verify_data + 4),
                            mbedtls_entropy_func,&ctr_drbg.p_entropy,(uchar *)"ssl_client1",len_00);
  if (server_fd.fd == 0) {
    printf(" ok\n");
    printf("  . Loading the CA root certificate ...");
    fflush(_stdout);
    server_fd.fd = mbedtls_x509_crt_parse
                             ((mbedtls_x509_crt *)local_ee0,
                              (uchar *)
                              "-----BEGIN CERTIFICATE-----\r\nMIIDhzCCAm+gAwIBAgIBADANBgkqhkiG9w0BAQUFADA7MQswCQYDVQQGEwJOTDER\r\nMA8GA1UEChMIUG9sYXJTU0wxGTAXBgNVBAMTEFBvbGFyU1NMIFRlc3QgQ0EwHhcN\r\nMTEwMjEyMTQ0NDAwWhcNMjEwMjEyMTQ0NDAwWjA7MQswCQYDVQQGEwJOTDERMA8G\r\nA1UEChMIUG9sYXJTU0wxGTAXBgNVBAMTEFBvbGFyU1NMIFRlc3QgQ0EwggEiMA0G\r\nCSqGSIb3DQEBAQUAA4IBDwAwggEKAoIBAQDA3zf8F7vglp0/ht6WMn1EpRagzSHx\r\nmdTs6st8GFgIlKXsm8WL3xoemTiZhx57wI053zhdcHgH057Zk+i5clHFzqMwUqny\r\n50BwFMtEonILwuVA+T7lpg6z+exKY8C4KQB0nFc7qKUEkHHxvYPZP9al4jwqj+8n\r\nYMPGn8u67GB9t+aEMr5P+1gmIgNb1LTV+/Xjli5wwOQuvfwu7uJBVcA0Ln0kcmnL\r\nR7EUQIN9Z/SG9jGr8XmksrUuEvmEF/Bibyc+E1ixVA0hmnM3oTDPb5Lc9un8rNsu\r\nKNF+AksjoBXyOGVkCeoMbo4bF6BxyLObyavpw/LPh5aPgAIynplYb6LVAgMBAAGj\r\ngZUwgZIwDAYDVR0TBAUwAwEB/zAdBgNVHQ4EFgQUtFrkpbPe0lL2udWmlQ/rPrzH\r\n/f8wYwYDVR0jBFwwWoAUtFrkpbPe0lL2udWmlQ/rPrzH/f+hP6Q9MDsxCzAJBgNV\r\nBAYTAk5MMREwDwYDVQQKEwhQb2xhclNTTDEZMBcGA1UEAxMQUG9sYXJTU0wgVGVz\r\ndCBDQYIBADANBgkqhkiG9w0BAQUFAAOCAQEAuP1U2ABUkIslsCfdlc2i94QHHYeJ\r\nSsR4EdgHtdciUI5I62J6Mom+Y0dT/7a+8S6MVMCZP6C5NyNyXw1GWY/YR82XTJ8H\r\nDBJiCTok5DbZ6SzaONBzdWHXwWwmi5vg1dxn7YxrM9d0IjxM27WNKs4sDQhZBQkF\r\npjmfs2cb4oPl4Y9T9meTx/lvdkRYEug61Jfn6cA+qHpyPYdTH+UshITnmp5/Ztkf\r\nm/UTSLBNFNHesiTZeH31NcxYGdHSme9Nc/gfidRa0FLOCfWxRlFqAI47zG9jAQCZ\r\n7Z2mCGDNMhjQc+BYcdnl0lPXjdDK6V0qCg1dVewhUBcW5gZKzV7e9+DpVA==\r\n-----END CERTIFICATE-----\r\n-----BEGIN CERTIFICATE-----\r\nMIICUjCCAdegAwIBAgIJAMFD4n5iQ8zoMAoGCCqGSM49BAMCMD4xCzAJBgNVBAYT\r\nAk5MMREwDwYDVQQKEwhQb2xhclNTTDEcMBoGA1UEAxMTUG9sYXJzc2wgVGVzdCBF\r\nQyBDQTAeFw0xMzA5MjQxNTQ5NDhaFw0yMzA5MjIxNTQ5NDhaMD4xCzAJBgNVBAYT\r\nAk5MMREwDwYDVQQKEwhQb2xhclNTTDEcMBoGA1UEAxMTUG9sYXJzc2wgVGVzdCBF\r\nQyBDQTB2MBAGByqGSM49AgEGBSuBBAAiA2IABMPaKzRBN1gvh1b+/Im6KUNLTuBu\r\nww5XUzM5WNRStJGVOQsj318XJGJI/BqVKc4sLYfCiFKAr9ZqqyHduNMcbli4yuiy\r\naY7zQa0pw7RfdadHb9UZKVVpmlM7ILRmFmAzHqOBoDCBnTAdBgNVHQ4EFgQUnW0g\r\nJEkBPyvLeLUZvH4kydv7NnwwbgYDVR0jBGcwZYAUnW0gJEkBPyvLeLUZvH4kydv7\r\nNnyhQqRAMD4xCzAJBgNVBAYTAk5MMREwDwYDVQQKEwhQb2xhclNTTDEcMBoGA1UE\r\nAxMTUG9sYXJzc2wgVGVzdCBFQyBDQYIJAMFD4n5iQ8zoMAwGA1UdEwQFMAMBAf8w\r\nCgYIKoZIzj0EAwIDaQAwZgIxAMO0YnNWKJUAfXgSJtJxexn4ipg+k..." /* TRUNCATED STRING LITERAL */
                              ,0x88d);
    if (server_fd.fd < 0) {
      printf(" failed\n  !  mbedtls_x509_crt_parse returned -0x%x\n\n",(ulong)(uint)-server_fd.fd);
    }
    else {
      printf(" ok (%d skipped)\n",(ulong)(uint)server_fd.fd);
      printf("  . Connecting to tcp/%s/%s...","localhost","4433");
      fflush(_stdout);
      server_fd.fd = mbedtls_net_connect(&local_18,"localhost","4433",0);
      if (server_fd.fd == 0) {
        printf(" ok\n");
        printf("  . Setting up the SSL/TLS structure...");
        fflush(_stdout);
        server_fd.fd = mbedtls_ssl_config_defaults((mbedtls_ssl_config *)&cacert.next,0,0,0);
        if (server_fd.fd == 0) {
          printf(" ok\n");
          mbedtls_ssl_conf_authmode((mbedtls_ssl_config *)&cacert.next,1);
          mbedtls_ssl_conf_ca_chain
                    ((mbedtls_ssl_config *)&cacert.next,(mbedtls_x509_crt *)local_ee0,
                     (mbedtls_x509_crl *)0x0);
          mbedtls_ssl_conf_rng
                    ((mbedtls_ssl_config *)&cacert.next,mbedtls_ctr_drbg_random,
                     ssl.peer_verify_data + 4);
          mbedtls_ssl_conf_dbg((mbedtls_ssl_config *)&cacert.next,my_debug,_stdout);
          server_fd.fd = mbedtls_ssl_setup((mbedtls_ssl_context *)&conf.max_major_ver,
                                           (mbedtls_ssl_config *)&cacert.next);
          if (server_fd.fd == 0) {
            server_fd.fd = mbedtls_ssl_set_hostname
                                     ((mbedtls_ssl_context *)&conf.max_major_ver,"localhost");
            if (server_fd.fd == 0) {
              mbedtls_ssl_set_bio((mbedtls_ssl_context *)&conf.max_major_ver,&local_18,
                                  mbedtls_net_send,mbedtls_net_recv,
                                  (mbedtls_ssl_recv_timeout_t *)0x0);
              printf("  . Performing the SSL/TLS handshake...");
              fflush(_stdout);
              do {
                server_fd.fd = mbedtls_ssl_handshake((mbedtls_ssl_context *)&conf.max_major_ver);
                if (server_fd.fd == 0) {
                  printf(" ok\n");
                  printf("  . Verifying peer X.509 certificate...");
                  flags_00 = mbedtls_ssl_get_verify_result
                                       ((mbedtls_ssl_context *)&conf.max_major_ver);
                  if (flags_00 == 0) {
                    printf(" ok\n");
                  }
                  else {
                    printf(" failed\n");
                    mbedtls_x509_crt_verify_info(local_10e8,0x200,"  ! ",flags_00);
                    printf("%s\n",local_10e8);
                  }
                  printf("  > Write to server:");
                  fflush(_stdout);
                  flags = sprintf((char *)&pers,"GET / HTTP/1.0\r\n\r\n");
                  goto LAB_0010f8a1;
                }
              } while ((server_fd.fd == -0x6900) || (server_fd.fd == -0x6880));
              printf(" failed\n  ! mbedtls_ssl_handshake returned -0x%x\n\n",
                     (ulong)(uint)-server_fd.fd);
            }
            else {
              printf(" failed\n  ! mbedtls_ssl_set_hostname returned %d\n\n",
                     (ulong)(uint)server_fd.fd);
            }
          }
          else {
            printf(" failed\n  ! mbedtls_ssl_setup returned %d\n\n",(ulong)(uint)server_fd.fd);
          }
        }
        else {
          printf(" failed\n  ! mbedtls_ssl_config_defaults returned %d\n\n",
                 (ulong)(uint)server_fd.fd);
        }
      }
      else {
        printf(" failed\n  ! mbedtls_net_connect returned %d\n\n",(ulong)(uint)server_fd.fd);
      }
    }
  }
  else {
    printf(" failed\n  ! mbedtls_ctr_drbg_seed returned %d\n",(ulong)(uint)server_fd.fd);
  }
  goto LAB_0010f9dd;
  while ((server_fd.fd == 0xffff9700 || (server_fd.fd == 0xffff9780))) {
LAB_0010f8a1:
    server_fd.fd = mbedtls_ssl_write((mbedtls_ssl_context *)&conf.max_major_ver,(uchar *)&pers,
                                     (long)(int)flags);
    if (0 < server_fd.fd) {
      flags = server_fd.fd;
      printf(" %d bytes written\n\n%s",(ulong)(uint)server_fd.fd,&pers);
      printf("  < Read from server:");
      fflush(_stdout);
      goto LAB_0010f925;
    }
  }
  printf(" failed\n  ! mbedtls_ssl_write returned %d\n\n",(ulong)(uint)server_fd.fd);
  goto LAB_0010f9dd;
LAB_0010f925:
  do {
    do {
      flags = 0x3ff;
      memset(&pers,0,0x400);
      server_fd.fd = mbedtls_ssl_read((mbedtls_ssl_context *)&conf.max_major_ver,(uchar *)&pers,
                                      (long)(int)flags);
    } while (server_fd.fd == 0xffff9700);
  } while (server_fd.fd == 0xffff9780);
  if (server_fd.fd == 0xffff8780) goto LAB_0010f9d1;
  if (server_fd.fd < 0) {
    printf("failed\n  ! mbedtls_ssl_read returned %d\n\n",(ulong)(uint)server_fd.fd);
    goto LAB_0010f9d1;
  }
  if (server_fd.fd != 0) {
    flags = server_fd.fd;
    printf(" %d bytes read\n\n%s",(ulong)(uint)server_fd.fd,&pers);
    goto LAB_0010f925;
  }
  printf("\n\nEOF\n\n");
LAB_0010f9d1:
  mbedtls_ssl_close_notify((mbedtls_ssl_context *)&conf.max_major_ver);
LAB_0010f9dd:
  if (server_fd.fd != 0) {
    mbedtls_strerror(server_fd.fd,local_1158,100);
    printf("Last error was: %d - %s\n\n",(ulong)(uint)server_fd.fd,local_1158);
  }
  mbedtls_net_free(&local_18);
  mbedtls_x509_crt_free((mbedtls_x509_crt *)local_ee0);
  mbedtls_ssl_free((mbedtls_ssl_context *)&conf.max_major_ver);
  mbedtls_ssl_config_free((mbedtls_ssl_config *)&cacert.next);
  mbedtls_ctr_drbg_free((mbedtls_ctr_drbg_context *)(ssl.peer_verify_data + 4));
  mbedtls_entropy_free((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
  return server_fd.fd;
}

Assistant:

int main( void )
{
    int ret, len;
    mbedtls_net_context server_fd;
    uint32_t flags;
    unsigned char buf[1024];
    const char *pers = "ssl_client1";

    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    mbedtls_ssl_context ssl;
    mbedtls_ssl_config conf;
    mbedtls_x509_crt cacert;

#if defined(MBEDTLS_DEBUG_C)
    mbedtls_debug_set_threshold( DEBUG_LEVEL );
#endif

    /*
     * 0. Initialize the RNG and the session data
     */
    mbedtls_net_init( &server_fd );
    mbedtls_ssl_init( &ssl );
    mbedtls_ssl_config_init( &conf );
    mbedtls_x509_crt_init( &cacert );
    mbedtls_ctr_drbg_init( &ctr_drbg );

    mbedtls_printf( "\n  . Seeding the random number generator..." );
    fflush( stdout );

    mbedtls_entropy_init( &entropy );
    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               strlen( pers ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * 0. Initialize certificates
     */
    mbedtls_printf( "  . Loading the CA root certificate ..." );
    fflush( stdout );

    ret = mbedtls_x509_crt_parse( &cacert, (const unsigned char *) mbedtls_test_cas_pem,
                          mbedtls_test_cas_pem_len );
    if( ret < 0 )
    {
        mbedtls_printf( " failed\n  !  mbedtls_x509_crt_parse returned -0x%x\n\n", -ret );
        goto exit;
    }

    mbedtls_printf( " ok (%d skipped)\n", ret );

    /*
     * 1. Start the connection
     */
    mbedtls_printf( "  . Connecting to tcp/%s/%s...", SERVER_NAME, SERVER_PORT );
    fflush( stdout );

    if( ( ret = mbedtls_net_connect( &server_fd, SERVER_NAME,
                                         SERVER_PORT, MBEDTLS_NET_PROTO_TCP ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_connect returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * 2. Setup stuff
     */
    mbedtls_printf( "  . Setting up the SSL/TLS structure..." );
    fflush( stdout );

    if( ( ret = mbedtls_ssl_config_defaults( &conf,
                    MBEDTLS_SSL_IS_CLIENT,
                    MBEDTLS_SSL_TRANSPORT_STREAM,
                    MBEDTLS_SSL_PRESET_DEFAULT ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ssl_config_defaults returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /* OPTIONAL is not optimal for security,
     * but makes interop easier in this simplified example */
    mbedtls_ssl_conf_authmode( &conf, MBEDTLS_SSL_VERIFY_OPTIONAL );
    mbedtls_ssl_conf_ca_chain( &conf, &cacert, NULL );
    mbedtls_ssl_conf_rng( &conf, mbedtls_ctr_drbg_random, &ctr_drbg );
    mbedtls_ssl_conf_dbg( &conf, my_debug, stdout );

    if( ( ret = mbedtls_ssl_setup( &ssl, &conf ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ssl_setup returned %d\n\n", ret );
        goto exit;
    }

    if( ( ret = mbedtls_ssl_set_hostname( &ssl, SERVER_NAME ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ssl_set_hostname returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_ssl_set_bio( &ssl, &server_fd, mbedtls_net_send, mbedtls_net_recv, NULL );

    /*
     * 4. Handshake
     */
    mbedtls_printf( "  . Performing the SSL/TLS handshake..." );
    fflush( stdout );

    while( ( ret = mbedtls_ssl_handshake( &ssl ) ) != 0 )
    {
        if( ret != MBEDTLS_ERR_SSL_WANT_READ && ret != MBEDTLS_ERR_SSL_WANT_WRITE )
        {
            mbedtls_printf( " failed\n  ! mbedtls_ssl_handshake returned -0x%x\n\n", -ret );
            goto exit;
        }
    }

    mbedtls_printf( " ok\n" );

    /*
     * 5. Verify the server certificate
     */
    mbedtls_printf( "  . Verifying peer X.509 certificate..." );

    /* In real life, we probably want to bail out when ret != 0 */
    if( ( flags = mbedtls_ssl_get_verify_result( &ssl ) ) != 0 )
    {
        char vrfy_buf[512];

        mbedtls_printf( " failed\n" );

        mbedtls_x509_crt_verify_info( vrfy_buf, sizeof( vrfy_buf ), "  ! ", flags );

        mbedtls_printf( "%s\n", vrfy_buf );
    }
    else
        mbedtls_printf( " ok\n" );

    /*
     * 3. Write the GET request
     */
    mbedtls_printf( "  > Write to server:" );
    fflush( stdout );

    len = sprintf( (char *) buf, GET_REQUEST );

    while( ( ret = mbedtls_ssl_write( &ssl, buf, len ) ) <= 0 )
    {
        if( ret != MBEDTLS_ERR_SSL_WANT_READ && ret != MBEDTLS_ERR_SSL_WANT_WRITE )
        {
            mbedtls_printf( " failed\n  ! mbedtls_ssl_write returned %d\n\n", ret );
            goto exit;
        }
    }

    len = ret;
    mbedtls_printf( " %d bytes written\n\n%s", len, (char *) buf );

    /*
     * 7. Read the HTTP response
     */
    mbedtls_printf( "  < Read from server:" );
    fflush( stdout );

    do
    {
        len = sizeof( buf ) - 1;
        memset( buf, 0, sizeof( buf ) );
        ret = mbedtls_ssl_read( &ssl, buf, len );

        if( ret == MBEDTLS_ERR_SSL_WANT_READ || ret == MBEDTLS_ERR_SSL_WANT_WRITE )
            continue;

        if( ret == MBEDTLS_ERR_SSL_PEER_CLOSE_NOTIFY )
            break;

        if( ret < 0 )
        {
            mbedtls_printf( "failed\n  ! mbedtls_ssl_read returned %d\n\n", ret );
            break;
        }

        if( ret == 0 )
        {
            mbedtls_printf( "\n\nEOF\n\n" );
            break;
        }

        len = ret;
        mbedtls_printf( " %d bytes read\n\n%s", len, (char *) buf );
    }
    while( 1 );

    mbedtls_ssl_close_notify( &ssl );

exit:

#ifdef MBEDTLS_ERROR_C
    if( ret != 0 )
    {
        char error_buf[100];
        mbedtls_strerror( ret, error_buf, 100 );
        mbedtls_printf("Last error was: %d - %s\n\n", ret, error_buf );
    }
#endif

    mbedtls_net_free( &server_fd );

    mbedtls_x509_crt_free( &cacert );
    mbedtls_ssl_free( &ssl );
    mbedtls_ssl_config_free( &conf );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( ret );
}